

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void trial::protocol::serialization::
     save_overloader<trial::protocol::bintoken::oarchive,_std::map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_void>
     ::save(oarchive *ar,
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *data,uint protocol_version)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  uint protocol_version_local;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *data_local;
  oarchive *ar_local;
  
  it._M_node._4_4_ = protocol_version;
  bintoken::oarchive::save<trial::protocol::bintoken::token::begin_assoc_array>(ar);
  bintoken::oarchive::save<trial::protocol::bintoken::token::null>(ar);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(data);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(data);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_28);
    bintoken::oarchive::save_override<int>(ar,&ppVar2->first,(ulong)it._M_node._4_4_);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_28);
    bintoken::oarchive::save_override<std::__cxx11::string>
              (ar,&ppVar2->second,(ulong)it._M_node._4_4_);
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_28);
  }
  bintoken::oarchive::save<trial::protocol::bintoken::token::end_assoc_array>(ar);
  return;
}

Assistant:

static void save(protocol::bintoken::oarchive& ar,
                     const std::map<Key, T, Compare, Allocator>& data,
                     const unsigned int protocol_version)
    {
        ar.save<bintoken::token::begin_assoc_array>();
        ar.save<bintoken::token::null>();
        for (typename std::map<Key, T, Compare, Allocator>::const_iterator it = data.begin();
             it != data.end();
             ++it)
        {
            ar.save_override(it->first, protocol_version);
            ar.save_override(it->second, protocol_version);
        }
        ar.save<bintoken::token::end_assoc_array>();
    }